

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O3

pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> __thiscall
mjs::object::find(object *this,wstring_view key)

{
  gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>::gc_table,_true> *this_00;
  uint uVar1;
  bool bVar2;
  gc_vector<mjs::object::property> *pgVar3;
  gc_table *this_01;
  gc_table *pgVar4;
  gc_table *pgVar5;
  gc_vector<mjs::object::property> *__range2;
  property *p;
  pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> pVar6;
  
  pgVar3 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true>::dereference
                     (&this->properties_,this->heap_);
  this_00 = &pgVar3->table_;
  this_01 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>::gc_table,_true>::
            dereference(this_00,pgVar3->heap_);
  pgVar4 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>::gc_table,_true>::dereference
                     (this_00,pgVar3->heap_);
  pgVar5 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>::gc_table,_true>::dereference
                     (this_00,pgVar3->heap_);
  uVar1 = pgVar5->length_;
  do {
    this_01 = this_01 + 1;
    if (this_01 == pgVar4 + (ulong)uVar1 + 1) {
      this_01 = (gc_table *)0x0;
      break;
    }
    bVar2 = property::key_matches((property *)this_01,this->heap_,key);
  } while (!bVar2);
  pVar6.second = pgVar3;
  pVar6.first = (property *)this_01;
  return pVar6;
}

Assistant:

std::pair<property*, gc_vector<property>*> find(const std::wstring_view key) const {
        auto& props = properties_.dereference(heap_);
        for (auto& p: props) {
            if (p.key_matches(heap_, key)) {
                return { &p, &props };
            }
        }
        return {nullptr, &props};
    }